

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O0

parasail_profile_t *
parasail_profile_create_avx_256_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  __m256i *palVar1;
  parasail_matrix_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  __m256i_32_t t;
  parasail_profile_t *profile;
  int32_t index;
  __m256i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  int32_t n;
  int32_t segNum;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1Len;
  int local_ec;
  int local_e8;
  int local_e4;
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  undefined8 local_b8;
  int local_ac;
  __m256i *local_a8;
  int local_a0;
  undefined4 local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  parasail_matrix_t *local_80;
  char *local_70;
  parasail_profile_t *local_68;
  
  local_84 = 0;
  local_88 = 0;
  local_8c = 0;
  local_90 = 0;
  local_94 = 0;
  local_98 = 0;
  local_9c = 8;
  local_a0 = 0;
  local_a8 = (__m256i *)0x0;
  local_ac = 0;
  local_b8 = 0;
  if (in_RDX == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_avx_256_32","matrix");
    local_68 = (parasail_profile_t *)0x0;
  }
  else if ((in_RDX->type == 0) && (in_RDI == (char *)0x0)) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_avx_256_32","s1");
    local_68 = (parasail_profile_t *)0x0;
  }
  else {
    local_e4 = in_ESI;
    if (in_RDX->type != 0) {
      local_e4 = in_RDX->length;
    }
    local_84 = local_e4;
    local_98 = in_RDX->size;
    local_a0 = (local_e4 + 7) / 8;
    local_80 = in_RDX;
    local_70 = in_RDI;
    local_a8 = parasail_memalign___m256i(0x20,(long)(local_98 * local_a0));
    if (local_a8 == (__m256i *)0x0) {
      local_68 = (parasail_profile_t *)0x0;
    }
    else {
      local_68 = parasail_profile_new(local_70,local_84,local_80);
      if (local_68 == (parasail_profile_t *)0x0) {
        local_68 = (parasail_profile_t *)0x0;
      }
      else {
        for (local_90 = 0; local_90 < local_98; local_90 = local_90 + 1) {
          for (local_88 = 0; local_88 < local_a0; local_88 = local_88 + 1) {
            local_8c = local_88;
            for (local_94 = 0; local_94 < 8; local_94 = local_94 + 1) {
              if (local_80->type == 0) {
                if (local_8c < local_84) {
                  local_e8 = local_80->matrix
                             [local_98 * local_90 + local_80->mapper[(byte)local_70[local_8c]]];
                }
                else {
                  local_e8 = 0;
                }
                *(int *)((long)&local_e0 + (long)local_94 * 4) = local_e8;
              }
              else {
                if (local_8c < local_84) {
                  local_ec = local_80->matrix
                             [local_98 * local_8c +
                              local_80->mapper[(byte)local_80->alphabet[local_90]]];
                }
                else {
                  local_ec = 0;
                }
                *(int *)((long)&local_e0 + (long)local_94 * 4) = local_ec;
              }
              local_8c = local_a0 + local_8c;
            }
            palVar1 = local_a8 + local_ac;
            (*palVar1)[0] = local_e0;
            (*palVar1)[1] = lStack_d8;
            (*palVar1)[2] = lStack_d0;
            (*palVar1)[3] = lStack_c8;
            local_ac = local_ac + 1;
          }
        }
        (local_68->profile32).score = local_a8;
        local_68->free = parasail_free___m256i;
      }
    }
  }
  return local_68;
}

Assistant:

parasail_profile_t * parasail_profile_create_avx_256_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_32_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->free = &parasail_free___m256i;
    return profile;
}